

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::Tex2DCompletenessCase::iterate(Tex2DCompletenessCase *this)

{
  TestLog *log;
  RenderContext *context;
  bool bVar1;
  int iVar2;
  deUint32 seed;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Surface *result;
  char *description;
  int width;
  CompareLogMode logMode;
  RGBA in_R9D;
  int height;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Random random;
  Vec2 local_b8;
  PixelBufferAccess local_b0;
  TextureRenderer renderer;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  width = *(int *)CONCAT44(extraout_var,iVar2);
  if (0x3f < *(int *)CONCAT44(extraout_var,iVar2)) {
    width = 0x40;
  }
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 4);
  height = 0x40;
  if (iVar2 < 0x40) {
    height = iVar2;
  }
  log = this->m_testCtx->m_log;
  logMode = COMPARE_LOG_RESULT;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&renderer,this->m_renderCtx,log,GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  tcu::Surface::Surface(&renderedFrame,width,height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  seed = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&random.m_rnd,seed);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = de::Random::getInt(&random,0,*(int *)CONCAT44(extraout_var_01,iVar2) - width);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = de::Random::getInt(&random,0,*(int *)(CONCAT44(extraout_var_02,iVar3) + 4) - height);
  local_b0.super_ConstPixelBufferAccess.m_format.order = R;
  local_b0.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_b8.m_data[0] = 1.0;
  local_b8.m_data[1] = 1.0;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)&local_b0,&local_b8);
  glwViewport(iVar2,iVar3,width,height);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&renderer,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,TEXTURETYPE_2D);
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_b0,&renderedFrame);
  result = (Surface *)&local_b0;
  glu::readPixels(context,iVar2,iVar3,(PixelBufferAccess *)result);
  bVar1 = compareToConstantColor
                    (log,(char *)&renderedFrame,(char *)(ulong)(this->m_compareColor).m_value,result
                     ,logMode,in_R9D);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this->m_testCtx,(uint)!bVar1,description);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&renderedFrame);
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&renderer);
  return STOP;
}

Assistant:

Tex2DCompletenessCase::IterateResult Tex2DCompletenessCase::iterate (void)
{
	int					viewportWidth	= de::min(64, m_renderCtx.getRenderTarget().getWidth());
	int					viewportHeight	= de::min(64, m_renderCtx.getRenderTarget().getHeight());
	TestLog&			log				= m_testCtx.getLog();
	TextureRenderer		renderer		(m_renderCtx, log, glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP);
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);
	vector<float>		texCoord;

	de::Random			random			(deStringHash(getName()));
	int					offsetX			= random.getInt(0, m_renderCtx.getRenderTarget().getWidth()		- viewportWidth	);
	int					offsetY			= random.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportHeight);

	computeQuadTexCoord2D	(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	glViewport				(offsetX, offsetY, viewportWidth, viewportHeight);

	createTexture			();
	renderer.renderQuad		(0, &texCoord[0], glu::TextureTestUtil::TEXTURETYPE_2D);
	glu::readPixels			(m_renderCtx, offsetX, offsetY, renderedFrame.getAccess());

	bool isOk = compareToConstantColor(log, "Result", "Image comparison result", renderedFrame, tcu::COMPARE_LOG_RESULT, m_compareColor);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");
	return STOP;
}